

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * pugi::impl::anon_unknown_0::
         strconv_pcdata_impl<pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_true>
         ::parse(char_t *s)

{
  byte bVar1;
  byte *s_00;
  char_t *pcVar2;
  char_t *pcVar3;
  byte *pbVar4;
  bool bVar5;
  gap g;
  gap local_38;
  
  local_38.end = (char_t *)0x0;
  local_38.size = 0;
  pbVar4 = (byte *)s;
LAB_00154774:
  do {
    s_00 = pbVar4;
    if (((anonymous_namespace)::chartype_table[*pbVar4] & 1) == 0) {
      if (((anonymous_namespace)::chartype_table[pbVar4[1]] & 1) != 0) {
        s_00 = pbVar4 + 1;
        goto LAB_00154841;
      }
      if (((anonymous_namespace)::chartype_table[pbVar4[2]] & 1) != 0) {
        s_00 = pbVar4 + 2;
        goto LAB_00154841;
      }
      bVar5 = ((anonymous_namespace)::chartype_table[pbVar4[3]] & 1) == 0;
      if (bVar5) {
        s_00 = pbVar4 + 4;
      }
      else {
        s_00 = pbVar4 + 3;
      }
    }
    else {
LAB_00154841:
      bVar5 = false;
    }
    pbVar4 = s_00;
  } while (bVar5);
  bVar1 = *s_00;
  if (bVar1 == 0xd) {
    pbVar4 = s_00 + 1;
    *s_00 = 10;
    if (s_00[1] == 10) {
      if ((byte *)local_38.end != (byte *)0x0) {
        if (pbVar4 < local_38.end) {
          __assert_fail("s >= end",
                        "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                        ,0x999,
                        "void pugi::impl::(anonymous namespace)::gap::push(char_t *&, size_t)");
        }
        memmove(local_38.end + -local_38.size,local_38.end,(long)pbVar4 - (long)local_38.end);
      }
      pbVar4 = s_00 + 2;
      local_38.size = local_38.size + 1;
      local_38.end = (char_t *)pbVar4;
    }
    goto LAB_00154774;
  }
  if (bVar1 == 0x26) {
    pbVar4 = (byte *)strconv_escape((char_t *)s_00,&local_38);
    goto LAB_00154774;
  }
  if (bVar1 == 0) {
    pcVar2 = gap::flush(&local_38,(char_t *)s_00);
    goto LAB_0015487d;
  }
  if (bVar1 != 0x3c) {
    pbVar4 = s_00 + 1;
    goto LAB_00154774;
  }
  pcVar2 = gap::flush(&local_38,(char_t *)s_00);
  do {
    pcVar3 = pcVar2;
    if (pcVar3 <= s) break;
    pcVar2 = pcVar3 + -1;
  } while (((anonymous_namespace)::chartype_table[(byte)pcVar3[-1]] & 8) != 0);
  *pcVar3 = '\0';
  return (char_t *)(s_00 + 1);
  while (pcVar2 = pcVar3 + -1, ((anonymous_namespace)::chartype_table[(byte)pcVar3[-1]] & 8) != 0) {
LAB_0015487d:
    pcVar3 = pcVar2;
    if (pcVar3 <= s) break;
  }
  *pcVar3 = '\0';
  return (char_t *)s_00;
}

Assistant:

static char_t* parse(char_t* s)
		{
			gap g;

			char_t* begin = s;

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_pcdata));

				if (*s == '<') // PCDATA ends here
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s + 1;
				}
				else if (opt_eol::value && *s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
				{
					*s++ = '\n'; // replace first one with 0x0a

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (*s == 0)
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s;
				}
				else ++s;
			}
		}